

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

sexp_conflict
sexp_make_thread(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict thunk,
                sexp_conflict name)

{
  sexp psVar1;
  sexp in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  sexp in_R8;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  sexp_conflict *stack;
  sexp_conflict *local_50;
  undefined8 local_48;
  sexp_conflict local_40;
  sexp_sint_t *local_38;
  sexp local_30;
  sexp local_28;
  undefined8 local_18;
  long local_10;
  sexp_conflict local_8;
  
  local_40 = (sexp_conflict)0x43e;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_50,0,0x10);
  if ((((ulong)local_28 & 3) == 0) && (local_28->tag == 0x14)) {
    local_50 = &local_40;
    local_48 = *(undefined8 *)(local_10 + 0x6080);
    *(sexp_conflict ***)(local_10 + 0x6080) = &local_50;
    local_40 = (sexp_conflict)
               sexp_make_eval_context(local_10,0x3e,*(undefined8 *)(local_10 + 0x10),0);
    (local_40->value).type.finalize_name = local_30;
    (local_40->value).type.dl = local_28;
    (local_40->value).context.ip = (uchar *)((long)&((local_28->value).type.name)->value + 0x28);
    psVar1 = (local_40->value).type.name;
    local_38 = &(psVar1->value).uvector.length;
    (psVar1->value).type.id = (sexp)0x1;
    (psVar1->value).bytecode.length = 1;
    *local_38 = 1;
    (psVar1->value).type.setters = *(sexp *)(*(long *)(local_10 + 0x28) + 0xf8);
    (((local_40->value).type.name)->value).string.offset = 4;
    (local_40->value).context.last_fp = 0;
    psVar1 = (sexp)sexp_make_vector_op(local_40,0,2,9,0x3e);
    (local_40->value).type.id = psVar1;
    (((local_40->value).type.id)->value).string.offset = 1;
    (local_40->value).port.offset = 0x23e;
    *(undefined8 *)(local_10 + 0x6080) = local_48;
    local_8 = local_40;
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,0x14,local_28);
  }
  return local_8;
}

Assistant:

sexp sexp_make_thread (sexp ctx, sexp self, sexp_sint_t n, sexp thunk, sexp name) {
  sexp *stack;
  sexp_gc_var1(res);
  sexp_assert_type(ctx, sexp_procedurep, SEXP_PROCEDURE, thunk);
  sexp_gc_preserve1(ctx, res);
  res = sexp_make_eval_context(ctx, SEXP_FALSE, sexp_context_env(ctx), 0, 0);
  sexp_context_name(res) = name;
  sexp_context_proc(res) = thunk;
  sexp_context_ip(res) = sexp_bytecode_data(sexp_procedure_code(thunk));
  stack = sexp_stack_data(sexp_context_stack(res));
  stack[0] = stack[1] = stack[3] = SEXP_ZERO;
  stack[2] = sexp_global(ctx, SEXP_G_FINAL_RESUMER);
  sexp_context_top(res) = 4;
  sexp_context_last_fp(res) = 0;
  sexp_context_dk(res) = sexp_make_vector(res, SEXP_FOUR, SEXP_FALSE);
  sexp_vector_set(sexp_context_dk(res), SEXP_ZERO, SEXP_ZERO);
  /* reset parameters */
  sexp_context_params(res) = SEXP_NULL;
  /* alternately reset only the current exception handler */
  /* for (ls1=sexp_context_params(ctx), ls2=SEXP_NULL; sexp_pairp(ls1); ls1=sexp_cdr(ls1)) */
  /*   if (sexp_caar(ls1) != sexp_global(ctx, SEXP_G_ERR_HANDLER)) */
  /*     ls2 = sexp_cons(ctx, sexp_car(ls1), ls2); */
  /* sexp_context_params(res) = ls2; */
  sexp_gc_release1(ctx);
  return res;
}